

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O0

string * __thiscall
arc::to_string_abi_cxx11_(string *__return_storage_ptr__,arc *this,atom *a,int write)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  atom *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  double *pdVar8;
  ostream *poVar9;
  _func_error_vector<arc::atom,_std::allocator<arc::atom>_>_ptr_atom_ptr **pp_Var10;
  closure *pcVar11;
  closure *pcVar12;
  unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>
  *this_00;
  char *pcVar13;
  undefined1 *puVar14;
  int iVar15;
  uint *puVar16;
  ulong uVar17;
  atom local_930;
  string local_910;
  atom local_8f0;
  string local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  reference local_830;
  pair<const_arc::atom,_arc::atom> *p;
  iterator __end3;
  iterator __begin3;
  unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>
  *__range3;
  string local_7f0;
  atom local_7d0;
  string local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  atom local_710;
  string local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  atom local_6b0;
  undefined1 local_690 [8];
  atom a2;
  stringstream local_650 [8];
  stringstream ss_1;
  ostream local_640 [376];
  string local_4c8 [36];
  int local_4a4;
  stringstream local_4a0 [8];
  stringstream ss;
  ostream local_490 [376];
  atom local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  atom local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  atom local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  atom local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  atom local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  atom local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  atom local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  byte local_71;
  atom local_70;
  atom local_50;
  undefined1 local_1d;
  uint local_1c;
  arc *paStack_18;
  int write_local;
  atom *a_local;
  string *s;
  
  local_1c = (uint)a;
  local_1d = 0;
  paStack_18 = this;
  a_local = (atom *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  puVar16 = &switchD_00175bf6::switchdataD_0019c08c;
  iVar15 = 0x19c08c;
  switch(*(undefined4 *)this) {
  case 0:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"nil");
    break;
  case 1:
    local_71 = 0;
    atom::atom(&local_50,(atom *)this);
    uVar3 = listp(&local_50);
    uVar17 = (ulong)uVar3;
    bVar2 = false;
    if (uVar3 != 0) {
      atom::atom(&local_70,(atom *)this);
      local_71 = 1;
      sVar4 = len(&local_70);
      bVar2 = sVar4 == 2;
    }
    if ((local_71 & 1) != 0) {
      atom::~atom(&local_70);
    }
    atom::~atom(&local_50);
    if (bVar2) {
      paVar5 = car((atom *)this);
      bVar2 = is(paVar5,(atom *)sym_quote);
      iVar15 = (int)uVar17;
      if (bVar2) {
        paVar5 = cdr((atom *)this);
        paVar5 = car(paVar5);
        atom::atom(&local_d8,paVar5);
        to_string_abi_cxx11_(&local_b8,(arc *)&local_d8,(atom *)(ulong)local_1c,iVar15);
        std::operator+(&local_98,"\'",&local_b8);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_b8);
        atom::~atom(&local_d8);
        return __return_storage_ptr__;
      }
      paVar5 = car((atom *)this);
      bVar2 = is(paVar5,(atom *)sym_quasiquote);
      iVar15 = (int)uVar17;
      if (bVar2) {
        paVar5 = cdr((atom *)this);
        paVar5 = car(paVar5);
        atom::atom(&local_138,paVar5);
        to_string_abi_cxx11_(&local_118,(arc *)&local_138,(atom *)(ulong)local_1c,iVar15);
        std::operator+(&local_f8,"`",&local_118);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        atom::~atom(&local_138);
        return __return_storage_ptr__;
      }
      paVar5 = car((atom *)this);
      bVar2 = is(paVar5,(atom *)sym_unquote);
      iVar15 = (int)uVar17;
      if (bVar2) {
        paVar5 = cdr((atom *)this);
        paVar5 = car(paVar5);
        atom::atom(&local_198,paVar5);
        to_string_abi_cxx11_(&local_178,(arc *)&local_198,(atom *)(ulong)local_1c,iVar15);
        std::operator+(&local_158,",",&local_178);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        atom::~atom(&local_198);
        return __return_storage_ptr__;
      }
      paVar5 = car((atom *)this);
      bVar2 = is(paVar5,(atom *)sym_unquote_splicing);
      iVar15 = (int)uVar17;
      if (bVar2) {
        paVar5 = cdr((atom *)this);
        paVar5 = car(paVar5);
        atom::atom(&local_1f8,paVar5);
        to_string_abi_cxx11_(&local_1d8,(arc *)&local_1f8,(atom *)(ulong)local_1c,iVar15);
        std::operator+(&local_1b8,",@",&local_1d8);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
        atom::~atom(&local_1f8);
        return __return_storage_ptr__;
      }
    }
    paVar5 = car((atom *)this);
    atom::atom(&local_258,paVar5);
    to_string_abi_cxx11_(&local_238,(arc *)&local_258,(atom *)(ulong)local_1c,(int)uVar17);
    std::operator+(&local_218,"(",&local_238);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    atom::~atom(&local_258);
    paVar5 = cdr((atom *)this);
    atom::operator=((atom *)this,paVar5);
    while( true ) {
      bVar2 = no((atom *)this);
      iVar15 = (int)uVar17;
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      if (*(int *)this != 1) {
        atom::atom(&local_318,(atom *)this);
        to_string_abi_cxx11_(&local_2f8,(arc *)&local_318,(atom *)(ulong)local_1c,iVar15);
        std::operator+(&local_2d8," . ",&local_2f8);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2f8);
        atom::~atom(&local_318);
        break;
      }
      paVar5 = car((atom *)this);
      atom::atom(&local_2b8,paVar5);
      to_string_abi_cxx11_(&local_298,(arc *)&local_2b8,(atom *)(ulong)local_1c,(int)uVar17);
      std::operator+(&local_278," ",&local_298);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      atom::~atom(&local_2b8);
      paVar5 = cdr((atom *)this);
      atom::operator=((atom *)this,paVar5);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
    break;
  case 2:
    ppbVar6 = std::
              get<std::__cxx11::string*,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          *)(this + 8));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)*ppbVar6);
    break;
  case 3:
    std::__cxx11::stringstream::stringstream(local_4a0);
    local_4a4 = (int)std::setprecision(0x10);
    poVar9 = std::operator<<(local_490,(_Setprecision)local_4a4);
    pdVar8 = std::
             get<double,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                       ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)(this + 8));
    std::ostream::operator<<(poVar9,*pdVar8);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_4c8);
    std::__cxx11::string::~string(local_4c8);
    std::__cxx11::stringstream::~stringstream(local_4a0);
    break;
  case 4:
    std::__cxx11::stringstream::stringstream(local_650);
    poVar9 = std::operator<<(local_640,"#<builtin:");
    pp_Var10 = ___std__get<arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>_std__variant<std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>___
                         ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)(this + 8));
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pp_Var10);
    std::operator<<(poVar9,">");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               (string *)
               ((long)&a2.val.
                       super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       .
                       super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                       .
                       super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                       .
                       super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                       .
                       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
               + 0x10));
    std::__cxx11::string::~string
              ((string *)
               ((long)&a2.val.
                       super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       .
                       super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                       .
                       super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                       .
                       super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                       .
                       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
               + 0x10));
    std::__cxx11::stringstream::~stringstream(local_650);
    break;
  case 5:
    pcVar12 = atom::asp<arc::closure>((atom *)this);
    pcVar11 = atom::asp<arc::closure>((atom *)this);
    make_cons(&local_6b0,&pcVar12->args,&pcVar11->body);
    make_cons((atom *)local_690,(atom *)sym_fn,&local_6b0);
    atom::~atom(&local_6b0);
    atom::atom(&local_710,(atom *)local_690);
    to_string_abi_cxx11_(&local_6f0,(arc *)&local_710,(atom *)0x1,iVar15);
    std::operator+(&local_6d0,"#<closure>",&local_6f0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_6d0);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::__cxx11::string::~string((string *)&local_6f0);
    atom::~atom(&local_710);
    atom::~atom((atom *)local_690);
    break;
  case 6:
    pcVar12 = atom::asp<arc::closure>((atom *)this);
    atom::atom(&local_7d0,&pcVar12->args);
    to_string_abi_cxx11_(&local_7b0,(arc *)&local_7d0,(atom *)(ulong)local_1c,iVar15);
    std::operator+(&local_790,"#<macro:",&local_7b0);
    std::operator+(&local_770,&local_790," ");
    pcVar12 = atom::asp<arc::closure>((atom *)this);
    atom::atom((atom *)&__range3,&pcVar12->body);
    to_string_abi_cxx11_(&local_7f0,(arc *)&__range3,(atom *)(ulong)local_1c,iVar15);
    std::operator+(&local_750,&local_770,&local_7f0);
    std::operator+(&local_730,&local_750,">");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_730);
    std::__cxx11::string::~string((string *)&local_730);
    std::__cxx11::string::~string((string *)&local_750);
    std::__cxx11::string::~string((string *)&local_7f0);
    atom::~atom((atom *)&__range3);
    std::__cxx11::string::~string((string *)&local_770);
    std::__cxx11::string::~string((string *)&local_790);
    std::__cxx11::string::~string((string *)&local_7b0);
    atom::~atom(&local_7d0);
    break;
  case 7:
    if (local_1c != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
    }
    pbVar7 = atom::asp<std::__cxx11::string>((atom *)this);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pbVar7);
    if (local_1c != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
    }
    break;
  case 8:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"#<input>");
    break;
  case 9:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"#<input-pipe>");
    break;
  case 10:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"#<output>");
    break;
  case 0xb:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"#<table:(");
    this_00 = atom::
              asp<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>
                        ((atom *)this);
    __end3 = std::
             unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>
             ::begin(this_00);
    p = (pair<const_arc::atom,_arc::atom> *)
        std::
        unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>
        ::end(this_00);
    while (bVar2 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<const_arc::atom,_arc::atom>,_true>
                              ,(_Node_iterator_base<std::pair<const_arc::atom,_arc::atom>,_true> *)
                               &p), bVar2) {
      local_830 = std::__detail::_Node_iterator<std::pair<const_arc::atom,_arc::atom>,_false,_true>
                  ::operator*(&__end3);
      atom::atom(&local_8f0,&local_830->first);
      to_string_abi_cxx11_(&local_8d0,(arc *)&local_8f0,(atom *)(ulong)local_1c,(int)puVar16);
      std::operator+(&local_8b0,"(",&local_8d0);
      std::operator+(&local_890,&local_8b0," . ");
      atom::atom(&local_930,&local_830->second);
      to_string_abi_cxx11_(&local_910,(arc *)&local_930,(atom *)(ulong)local_1c,(int)puVar16);
      std::operator+(&local_870,&local_890,&local_910);
      std::operator+(&local_850,&local_870,")");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_850);
      std::__cxx11::string::~string((string *)&local_850);
      std::__cxx11::string::~string((string *)&local_870);
      std::__cxx11::string::~string((string *)&local_910);
      atom::~atom(&local_930);
      std::__cxx11::string::~string((string *)&local_890);
      std::__cxx11::string::~string((string *)&local_8b0);
      std::__cxx11::string::~string((string *)&local_8d0);
      atom::~atom(&local_8f0);
      std::__detail::_Node_iterator<std::pair<const_arc::atom,_arc::atom>,_false,_true>::operator++
                (&__end3);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")>");
    break;
  case 0xc:
    if (local_1c == 0) {
      pcVar13 = std::
                get<char,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                            *)(this + 8));
      cVar1 = *pcVar13;
      pcVar13 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *pcVar13 = cVar1;
      puVar14 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *puVar14 = 0;
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"#\\");
      pcVar13 = std::
                get<char,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                            *)(this + 8));
      switch(*pcVar13) {
      case '\0':
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"nul");
        break;
      default:
        pcVar13 = std::
                  get<char,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                            ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                              *)(this + 8));
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar13);
        break;
      case '\t':
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"tab");
        break;
      case '\n':
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"newline");
        break;
      case '\r':
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"return");
        break;
      case ' ':
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"space");
      }
    }
    break;
  case 0xd:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"#<continuation>");
    break;
  default:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"#<unknown type>");
  }
  return __return_storage_ptr__;
}

Assistant:

string to_string(atom a, int write) {
		string s;
		switch (a.type) {
		case T_NIL:
			s = "nil";
			break;
		case T_CONS: {
			if (listp(a) && len(a) == 2) {
				if (is(car(a), sym_quote)) {
					s = "'" + to_string(car(cdr(a)), write);
					break;
				}
				else if (is(car(a), sym_quasiquote)) {
					s = "`" + to_string(car(cdr(a)), write);
					break;
				}
				else if (is(car(a), sym_unquote)) {
					s = "," + to_string(car(cdr(a)), write);
					break;
				}
				else if (is(car(a), sym_unquote_splicing)) {
					s = ",@" + to_string(car(cdr(a)), write);
					break;
				}
			}
			s = "(" + to_string(car(a), write);
			a = cdr(a);
			while (!no(a)) {
				if (a.type == T_CONS) {
					s += " " + to_string(car(a), write);
					a = cdr(a);
				}
				else {
					s += " . " + to_string(a, write);
					break;
				}
			}
			s += ")";
			break;
		}
		case T_SYM:
			s = *get<sym>(a.val);
			break;
		case T_STRING:
			if (write) s += "\"";
			s += a.asp<string>();
			if (write) s += "\"";
			break;
		case T_NUM:
		{
			stringstream ss;
			ss << setprecision(16) << get<double>(a.val);
			s = ss.str();
			break;
		}
		case T_BUILTIN:
		{
			stringstream ss;
			ss << "#<builtin:" << (void*)get<builtin>(a.val) << ">";
			s = ss.str();
			break;
		}
		case T_CLOSURE:
		{
			atom a2 = make_cons(sym_fn, make_cons(a.asp<struct closure>().args, a.asp<struct closure>().body));
			s = "#<closure>" + to_string(a2, 1);
			break;
		}
		case T_MACRO:
			s = "#<macro:" + to_string(a.asp<struct closure>().args, write) +
				" " + to_string(a.asp<struct closure>().body, write) + ">";
			break;
		case T_INPUT:
			s = "#<input>";
			break;
		case T_INPUT_PIPE:
			s = "#<input-pipe>";
			break;
		case T_OUTPUT:
			s = "#<output>";
			break;
		case T_TABLE: {
			s += "#<table:(";
			for (auto& p : a.asp<table>()) {
				s += "(" + to_string(p.first, write) + " . " + to_string(p.second, write) + ")";
			}
			s += ")>";
			break; }
		case T_CHAR:
			if (write) {
				s += "#\\";
				switch (get<char>(a.val)) {
				case '\0': s += "nul"; break;
				case '\r': s += "return"; break;
				case '\n': s += "newline"; break;
				case '\t': s += "tab"; break;
				case ' ': s += "space"; break;
				default:
					s += get<char>(a.val);
				}
			}
			else {
				s[0] = get<char>(a.val);
				s[1] = '\0';
			}
			break;
		case T_CONTINUATION:
			s = "#<continuation>";
			break;
		default:
			s = "#<unknown type>";
			break;
		}
		return s;
	}